

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O1

bool stl_reader::StlFileHasASCIIFormat(char *filename)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  runtime_error *this;
  long lVar4;
  string firstWord;
  ifstream in;
  string asStack_3d8 [32];
  ostream *local_3b8;
  long local_3b0;
  ostream local_3a8;
  undefined7 uStack_3a7;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,filename,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    local_3b0 = 0;
    local_3a8 = (ostream)0x0;
    local_3b8 = &local_3a8;
    std::operator>>((istream *)local_230,(string *)&local_3b8);
    lVar2 = local_3b0;
    poVar1 = local_3b8;
    if (local_3b0 != 0) {
      lVar4 = 0;
      do {
        iVar3 = tolower((int)(char)poVar1[lVar4]);
        poVar1[lVar4] = SUB41(iVar3,0);
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_3b8);
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT71(uStack_3a7,local_3a8) + 1);
    }
    std::ifstream::~ifstream(local_230);
    return iVar3 == 0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_3a8,"Couldnt open file ",0x12);
  std::operator<<(&local_3a8,filename);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_3d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline bool StlFileHasASCIIFormat(const char* filename)
{
	using namespace std;
	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldnt open file " << filename);

	string firstWord;
	in >> firstWord;
	transform(firstWord.begin(), firstWord.end(), firstWord.begin(), ::tolower);

	return firstWord.compare("solid") == 0;
}